

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,SrcXprType *src,
          assign_op<double,_double> *param_3)

{
  Index rows;
  Index cols;
  Index IVar1;
  LhsNestedCleaned *lhs;
  RhsNestedCleaned *rhs;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  SrcXprType *src_local;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *dst_local;
  
  rows = Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
         ::rows(src);
  cols = Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
         ::cols(src);
  IVar1 = MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
          rows((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)dst);
  if (IVar1 == rows) {
    IVar1 = MapBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
            cols((MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  *)dst);
    if (IVar1 == cols) goto LAB_001cf56d;
  }
  DenseBase<Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::resize
            ((DenseBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)dst,rows,cols);
LAB_001cf56d:
  lhs = Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
        ::lhs(src);
  rhs = Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
        ::rhs(src);
  generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>const,-1,1,false>const>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,-1,-1,false>,-1,-1,false>,Eigen::DenseShape,Eigen::DenseShape,3>
  ::evalTo<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,1>,0,Eigen::Stride<0,0>>>(dst,lhs,rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }